

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void test_contains_all_different_sizes(void)

{
  uint64_t *puVar1;
  long lVar2;
  bool bVar3;
  _Bool _Var4;
  bitset_t *pbVar5;
  bitset_t *pbVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint64_t uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong auStack_78 [4];
  bitset_t *pbStack_58;
  bitset_t *pbStack_50;
  code *pcStack_48;
  bitset_t *pbStack_38;
  
  pbVar5 = bitset_create_with_capacity(10);
  pbVar6 = bitset_create_with_capacity(5);
  if ((pbVar5->arraysize != 0) || (_Var4 = bitset_grow(pbVar5,1), _Var4)) {
    *pbVar5->array = *pbVar5->array | 2;
  }
  if ((pbVar5->arraysize != 0) || (_Var4 = bitset_grow(pbVar5,1), _Var4)) {
    *pbVar5->array = *pbVar5->array | 0x10;
  }
  if ((pbVar5->arraysize != 0) || (_Var4 = bitset_grow(pbVar5,1), _Var4)) {
    *pbVar5->array = *pbVar5->array | 0x40;
  }
  if ((pbVar6->arraysize != 0) || (_Var4 = bitset_grow(pbVar6,1), _Var4)) {
    *pbVar6->array = *pbVar6->array | 2;
  }
  if ((pbVar6->arraysize != 0) || (_Var4 = bitset_grow(pbVar6,1), _Var4)) {
    *pbVar6->array = *pbVar6->array | 0x10;
  }
  _Var4 = bitset_contains_all(pbVar5,pbVar6);
  if (_Var4) {
    _Var4 = bitset_contains_all(pbVar6,pbVar5);
    if (!_Var4) {
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    test_contains_all_different_sizes_cold_1();
  }
  test_contains_all_different_sizes_cold_2();
  pcStack_48 = (code *)0x10246a;
  pbStack_38 = pbVar5;
  pbVar5 = bitset_create();
  uVar14 = 0;
  pcStack_48 = (code *)0x102475;
  pbVar6 = bitset_create();
  do {
    uVar12 = uVar14 >> 6;
    if (uVar12 < pbVar5->arraysize) {
LAB_00102496:
      pbVar5->array[uVar12] = pbVar5->array[uVar12] | 1L << ((byte)uVar14 & 0x3f);
    }
    else {
      pcStack_48 = (code *)0x102492;
      _Var4 = bitset_grow(pbVar5,uVar12 + 1);
      if (_Var4) goto LAB_00102496;
    }
    if ((uVar14 & 1) == 0) {
      if (pbVar6->arraysize <= uVar12) {
        pcStack_48 = (code *)0x1024c1;
        _Var4 = bitset_grow(pbVar6,uVar12 + 1);
        if (!_Var4) goto LAB_001024da;
      }
      pbVar6->array[uVar12] = pbVar6->array[uVar12] | 1L << ((byte)uVar14 & 0x3e);
    }
LAB_001024da:
    uVar14 = uVar14 + 1;
  } while (uVar14 != 1000);
  pcStack_48 = (code *)0x1024f1;
  _Var4 = bitset_contains_all(pbVar5,pbVar6);
  if (_Var4) {
    pcStack_48 = (code *)0x102500;
    _Var4 = bitset_contains_all(pbVar6,pbVar5);
    if (_Var4) goto LAB_0010256b;
    if (pbVar6->arraysize < 0x10) {
      pcStack_48 = (code *)0x102518;
      _Var4 = bitset_grow(pbVar6,0x10);
      if (_Var4) goto LAB_0010251c;
    }
    else {
LAB_0010251c:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pcStack_48 = (code *)0x102538;
    _Var4 = bitset_contains_all(pbVar5,pbVar6);
    if (!_Var4) {
      pcStack_48 = (code *)0x102547;
      _Var4 = bitset_contains_all(pbVar6,pbVar5);
      if (!_Var4) {
        pcStack_48 = (code *)0x102553;
        bitset_free(pbVar5);
        bitset_free(pbVar6);
        return;
      }
      goto LAB_00102575;
    }
  }
  else {
    pcStack_48 = (code *)0x10256b;
    test_contains_all_cold_1();
LAB_0010256b:
    pcStack_48 = (code *)0x102570;
    test_contains_all_cold_4();
  }
  pcStack_48 = (code *)0x102575;
  test_contains_all_cold_3();
LAB_00102575:
  pcStack_48 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar12 = 0;
  pbStack_58 = pbVar5;
  pbStack_50 = pbVar6;
  pcStack_48 = (code *)uVar14;
  pbVar5 = bitset_create();
  do {
    uVar14 = uVar12 >> 6;
    if (uVar14 < pbVar5->arraysize) {
LAB_001025ab:
      pbVar5->array[uVar14] = pbVar5->array[uVar14] | 1L << ((byte)uVar12 & 0x3f);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar14 + 1);
      if (_Var4) goto LAB_001025ab;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 100);
  uVar14 = 0x3e6;
  do {
    uVar14 = uVar14 + 2;
    uVar12 = uVar14 >> 6;
    if (uVar12 < pbVar5->arraysize) {
LAB_001025ed:
      pbVar5->array[uVar12] = pbVar5->array[uVar12] | 1L << ((byte)uVar14 & 0x3e);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar12 + 1);
      if (_Var4) goto LAB_001025ed;
    }
  } while (uVar14 < 0x44a);
  uVar14 = pbVar5->arraysize;
  uVar12 = 0;
  lVar9 = 0;
LAB_0010261a:
  uVar8 = uVar12 >> 6;
  if (uVar8 < uVar14) {
    puVar1 = pbVar5->array;
    uVar11 = (puVar1[uVar8] >> ((byte)uVar12 & 0x3f)) << ((byte)uVar12 & 0x3f);
    uVar10 = uVar12 & 0xffffffffffffffc0;
    uVar7 = 0;
    do {
      while (uVar11 == 0) {
        uVar8 = uVar8 + 1;
        if (uVar8 == uVar14) goto LAB_0010268b;
        uVar10 = uVar10 + 0x40;
        uVar11 = puVar1[uVar8];
        if (2 < uVar7) goto LAB_0010268b;
      }
      uVar13 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      auStack_78[uVar7] = uVar13 | uVar10;
      uVar13 = uVar11 - 1;
      if (uVar7 == 2) {
        uVar13 = 0xffffffffffffffff;
      }
      uVar7 = uVar7 + 1;
      uVar11 = uVar11 & uVar13;
    } while (uVar7 != 3);
    uVar7 = 3;
LAB_0010268b:
    if (uVar7 != 0) {
      uVar12 = auStack_78[uVar7 - 1];
    }
  }
  else {
    uVar7 = 0;
  }
  if (uVar7 != 0) {
    uVar8 = lVar9 * 2 + 800;
    uVar10 = 0;
    do {
      uVar13 = lVar9 + uVar10;
      if (99 < lVar9 + uVar10) {
        uVar13 = uVar8;
      }
      if (auStack_78[uVar10] != uVar13) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar10 = uVar10 + 1;
      uVar8 = uVar8 + 2;
    } while (uVar7 != uVar10);
    uVar12 = uVar12 + 1;
    lVar9 = uVar7 + lVar9;
    goto LAB_0010261a;
  }
  if (lVar9 == 0x96) {
    bitset_free(pbVar5);
    return;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar14 = 0;
  pbVar5 = bitset_create();
  do {
    uVar12 = uVar14 >> 6;
    if ((uVar12 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar12 + 1), _Var4)) {
      pbVar5->array[uVar12] = pbVar5->array[uVar12] | 1L << ((byte)uVar14 & 0x3f);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 100);
  uVar14 = 0x3e6;
  do {
    uVar14 = uVar14 + 2;
    uVar12 = uVar14 >> 6;
    if ((uVar12 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar12 + 1), _Var4)) {
      pbVar5->array[uVar12] = pbVar5->array[uVar12] | 1L << ((byte)uVar14 & 0x3e);
    }
  } while (uVar14 < 0x44a);
  uVar14 = 0;
  uVar12 = 0;
  do {
    uVar8 = uVar14 >> 6;
    if (uVar8 < pbVar5->arraysize) {
      uVar7 = pbVar5->array[uVar8] >> ((byte)uVar14 & 0x3f);
      if (uVar7 == 0) {
        lVar9 = uVar8 * -0x40;
        do {
          uVar8 = uVar8 + 1;
          if (pbVar5->arraysize == uVar8) goto LAB_001027e0;
          uVar7 = pbVar5->array[uVar8];
          lVar9 = lVar9 + -0x40;
        } while (uVar7 == 0);
        lVar2 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar14 = lVar2 - lVar9;
      }
      else {
        lVar9 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar14 = uVar14 + lVar9;
      }
      bVar3 = true;
    }
    else {
LAB_001027e0:
      bVar3 = false;
    }
    if (!bVar3) {
      if (uVar12 == 0x96) {
        bitset_free(pbVar5);
        return;
      }
      goto LAB_00102822;
    }
    uVar8 = uVar12 * 2 + 800;
    if (uVar12 < 100) {
      uVar8 = uVar12;
    }
    if (uVar14 != uVar8) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return;
    }
    uVar12 = uVar12 + 1;
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void test_contains_all_different_sizes() {
  const size_t superset_size = 10;
  const size_t subset_size = 5;

  bitset_t *superset = bitset_create_with_capacity(superset_size);
  bitset_t *subset = bitset_create_with_capacity(subset_size);

  bitset_set(superset, 1);
  bitset_set(superset, subset_size - 1);
  bitset_set(superset, subset_size + 1);

  bitset_set(subset, 1);
  bitset_set(subset, subset_size - 1);

  TEST_ASSERT(bitset_contains_all(superset, subset));
  TEST_ASSERT(!bitset_contains_all(subset, superset));

  bitset_free(superset);
  bitset_free(subset);
}